

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_7ec601::isDirentryToIgnore(char *fname)

{
  uint __line;
  char *__assertion;
  
  if (fname == (char *)0x0) {
    __assertion = "fname != nullptr";
    __line = 0x6d;
LAB_00288135:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx"
                  ,__line,"bool (anonymous namespace)::isDirentryToIgnore(const char *const)");
  }
  if (*fname == '.') {
    if (fname[1] == '\0') {
      return true;
    }
    if (fname[1] == '.') {
      return fname[2] == '\0';
    }
  }
  else if (*fname == '\0') {
    __assertion = "fname[0] != 0";
    __line = 0x6e;
    goto LAB_00288135;
  }
  return false;
}

Assistant:

bool isDirentryToIgnore(const char* const fname)
{
  assert(fname != nullptr);
  assert(fname[0] != 0);
  return fname[0] == '.' &&
    (fname[1] == 0 || (fname[1] == '.' && fname[2] == 0));
}